

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> __thiscall
SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
          (SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter> *this,char rhs)

{
  long lVar1;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar2;
  undefined3 in_register_00000031;
  
  lVar1 = *(long *)this;
  SVar2.m_int = lVar1 - CONCAT31(in_register_00000031,rhs);
  if (((lVar1 <= SVar2.m_int || -1 < rhs) || lVar1 < 0) && (SVar2.m_int <= lVar1 || rhs < '\0')) {
    return (SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)SVar2.m_int;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is an std::int64_t, rhs signed (up to 64-bit)
        // we have essentially 4 cases:
        //
        // 1) lhs positive, rhs positive - overflow not possible
        // 2) lhs positive, rhs negative - equivalent to addition - result >= lhs or error
        // 3) lhs negative, rhs positive - check result <= lhs
        // 4) lhs negative, rhs negative - overflow not possible

        std::int64_t tmp = (std::int64_t)((std::uint64_t)lhs - (std::uint64_t)rhs);

        // Note - ideally, we can order these so that true conditionals
        // lead to success, which enables better pipelining
        // It isn't practical here
        if( ( lhs >= 0 && rhs < 0 && tmp < lhs ) || // condition 2
            ( rhs >= 0 && tmp > lhs ) )             // condition 3
        {
            E::SafeIntOnOverflow();
        }

        result = (T)tmp;
    }